

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darRefact.c
# Opt level: O0

int Dar_ManRefactor(Aig_Man_t *pAig,Dar_RefPar_t *pPars)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Ref_Man_t *p_00;
  abctime aVar4;
  Vec_Ptr_t *vSupp;
  Vec_Ptr_t *vResult;
  Aig_Obj_t *pObj_00;
  abctime aVar5;
  Aig_Obj_t *p_01;
  Aig_Obj_t *pAVar6;
  abctime aVar7;
  int local_84;
  abctime clk;
  abctime clkStart;
  int nLevelMin;
  int Required;
  int i;
  int nNodesSaved2;
  int nNodesSaved;
  int nNodeAfter;
  int nNodeBefore;
  int nNodesOld;
  Aig_Obj_t *pObjNew;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vCut2;
  Vec_Ptr_t *vCut;
  Ref_Man_t *p;
  Dar_RefPar_t *pPars_local;
  Aig_Man_t *pAig_local;
  
  p_00 = Dar_ManRefStart(pAig,pPars);
  Aig_ManCleanup(pAig);
  Aig_ManFanoutStart(pAig);
  if (p_00->pPars->fUpdateLevel != 0) {
    Aig_ManStartReverseLevels(pAig,0);
  }
  aVar4 = Abc_Clock();
  vSupp = Vec_VecEntry(p_00->vCuts,0);
  vResult = Vec_VecEntry(p_00->vCuts,1);
  iVar1 = Aig_ManNodeNum(pAig);
  p_00->nNodesInit = iVar1;
  iVar1 = Vec_PtrSize(pAig->vObjs);
  for (nLevelMin = 0; iVar2 = Vec_PtrSize(pAig->vObjs), nLevelMin < iVar2; nLevelMin = nLevelMin + 1
      ) {
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,nLevelMin);
    if ((pObj_00 != (Aig_Obj_t *)0x0) && (iVar2 = Aig_ObjIsNode(pObj_00), iVar2 != 0)) {
      if ((iVar1 < nLevelMin) ||
         (((pAig->Time2Quit != 0 && ((nLevelMin & 0x100U) == 0)) &&
          (aVar7 = Abc_Clock(), pAig->Time2Quit < aVar7)))) break;
      Vec_VecClear(p_00->vCuts);
      aVar7 = Abc_Clock();
      iVar2 = Aig_ObjLevel(pObj_00);
      iVar2 = Abc_MaxInt(0,iVar2 + -10);
      i = Aig_NodeMffcSupp(pAig,pObj_00,iVar2,vSupp);
      if (i < p_00->pPars->nMffcMin) {
        aVar5 = Abc_Clock();
        p_00->timeCuts = (aVar5 - aVar7) + p_00->timeCuts;
      }
      else {
        p_00->nNodesTried = p_00->nNodesTried + 1;
        iVar3 = Vec_PtrSize(vSupp);
        if (p_00->pPars->nLeafMax < iVar3) {
          Aig_ManFindCut(pObj_00,vSupp,p_00->vCutNodes,p_00->pPars->nLeafMax,0x32);
          i = Aig_NodeMffcLabelCut(p_00->pAig,pObj_00,vSupp);
        }
        else {
          iVar3 = Vec_PtrSize(vSupp);
          if ((iVar3 < p_00->pPars->nLeafMax + -2) && (p_00->pPars->fExtend != 0)) {
            iVar2 = Dar_ObjCutLevelAchieved(vSupp,iVar2);
            if (iVar2 == 0) {
              iVar2 = Aig_NodeMffcExtendCut(pAig,pObj_00,vSupp,vResult);
              if ((iVar2 != 0) &&
                 (iVar2 = Aig_NodeMffcLabelCut(p_00->pAig,pObj_00,vSupp), iVar2 != i)) {
                __assert_fail("nNodesSaved2 == nNodesSaved",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darRefact.c"
                              ,0x22c,"int Dar_ManRefactor(Aig_Man_t *, Dar_RefPar_t *)");
              }
              iVar2 = Vec_PtrSize(vResult);
              if (p_00->pPars->nLeafMax < iVar2) {
                Vec_PtrClear(vResult);
              }
              iVar2 = Vec_PtrSize(vResult);
              if (0 < iVar2) {
                p_00->nNodesExten = p_00->nNodesExten + 1;
              }
            }
            else {
              p_00->nNodesBelow = p_00->nNodesBelow + 1;
            }
          }
        }
        aVar5 = Abc_Clock();
        p_00->timeCuts = (aVar5 - aVar7) + p_00->timeCuts;
        aVar7 = Abc_Clock();
        if (pAig->vLevelR == (Vec_Int_t *)0x0) {
          local_84 = 1000000000;
        }
        else {
          local_84 = Aig_ObjRequiredLevel(pAig,pObj_00);
        }
        Dar_ManRefactorTryCuts(p_00,pObj_00,i,local_84);
        aVar5 = Abc_Clock();
        p_00->timeEval = (aVar5 - aVar7) + p_00->timeEval;
        if ((p_00->GainBest < 1) && ((p_00->GainBest != 0 || (p_00->pPars->fUseZeros == 0)))) {
          if (p_00->pGraphBest != (Kit_Graph_t *)0x0) {
            Kit_GraphFree(p_00->pGraphBest);
          }
        }
        else {
          iVar2 = Aig_ManNodeNum(pAig);
          p_01 = Dar_RefactBuildGraph(pAig,p_00->vLeavesBest,p_00->pGraphBest);
          pAVar6 = Aig_Regular(p_01);
          if (local_84 < (int)((uint)((ulong)*(undefined8 *)&pAVar6->field_0x18 >> 0x20) & 0xffffff)
             ) {
            __assert_fail("(int)Aig_Regular(pObjNew)->Level <= Required",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darRefact.c"
                          ,0x24d,"int Dar_ManRefactor(Aig_Man_t *, Dar_RefPar_t *)");
          }
          Aig_ObjReplace(pAig,pObj_00,p_01,p_00->pPars->fUpdateLevel);
          iVar3 = Aig_ManNodeNum(pAig);
          if (iVar2 - iVar3 < p_00->GainBest) {
            __assert_fail("p->GainBest <= nNodeBefore - nNodeAfter",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darRefact.c"
                          ,0x252,"int Dar_ManRefactor(Aig_Man_t *, Dar_RefPar_t *)");
          }
          Kit_GraphFree(p_00->pGraphBest);
          p_00->nCutsUsed = p_00->nCutsUsed + 1;
        }
      }
    }
  }
  aVar7 = Abc_Clock();
  p_00->timeTotal = aVar7 - aVar4;
  p_00->timeOther = (p_00->timeTotal - p_00->timeCuts) - p_00->timeEval;
  Aig_ManFanoutStop(pAig);
  if (p_00->pPars->fUpdateLevel != 0) {
    Aig_ManStopReverseLevels(pAig);
  }
  Aig_ManCleanup(pAig);
  Dar_ManRefStop(p_00);
  iVar1 = Aig_ManCheck(pAig);
  if (iVar1 == 0) {
    printf("Dar_ManRefactor: The network check has failed.\n");
  }
  pAig_local._4_4_ = (uint)(iVar1 != 0);
  return pAig_local._4_4_;
}

Assistant:

int Dar_ManRefactor( Aig_Man_t * pAig, Dar_RefPar_t * pPars )
{
//    Bar_Progress_t * pProgress;
    Ref_Man_t * p;
    Vec_Ptr_t * vCut, * vCut2;
    Aig_Obj_t * pObj, * pObjNew;
    int nNodesOld, nNodeBefore, nNodeAfter, nNodesSaved, nNodesSaved2;
    int i, Required, nLevelMin;
    abctime clkStart, clk;

    // start the manager
    p = Dar_ManRefStart( pAig, pPars );
    // remove dangling nodes
    Aig_ManCleanup( pAig );
    // if updating levels is requested, start fanout and timing
    Aig_ManFanoutStart( pAig );
    if ( p->pPars->fUpdateLevel )
        Aig_ManStartReverseLevels( pAig, 0 );

    // resynthesize each node once
    clkStart = Abc_Clock();
    vCut = Vec_VecEntry( p->vCuts, 0 );
    vCut2 = Vec_VecEntry( p->vCuts, 1 );
    p->nNodesInit = Aig_ManNodeNum(pAig);
    nNodesOld = Vec_PtrSize( pAig->vObjs );
//    pProgress = Bar_ProgressStart( stdout, nNodesOld );
    Aig_ManForEachObj( pAig, pObj, i )
    {
//        Bar_ProgressUpdate( pProgress, i, NULL );
        if ( !Aig_ObjIsNode(pObj) )
            continue;
        if ( i > nNodesOld )
            break;
        if ( pAig->Time2Quit && !(i & 256) && Abc_Clock() > pAig->Time2Quit )
            break;
        Vec_VecClear( p->vCuts );

//printf( "\nConsidering node %d.\n", pObj->Id );
        // get the bounded MFFC size
clk = Abc_Clock();
        nLevelMin = Abc_MaxInt( 0, Aig_ObjLevel(pObj) - 10 );
        nNodesSaved = Aig_NodeMffcSupp( pAig, pObj, nLevelMin, vCut );
        if ( nNodesSaved < p->pPars->nMffcMin ) // too small to consider
        {
p->timeCuts += Abc_Clock() - clk;
            continue; 
        }
        p->nNodesTried++;
        if ( Vec_PtrSize(vCut) > p->pPars->nLeafMax ) // get one reconv-driven cut
        {
            Aig_ManFindCut( pObj, vCut, p->vCutNodes, p->pPars->nLeafMax, 50 );
            nNodesSaved = Aig_NodeMffcLabelCut( p->pAig, pObj, vCut );
        }
        else if ( Vec_PtrSize(vCut) < p->pPars->nLeafMax - 2 && p->pPars->fExtend )
        {
            if ( !Dar_ObjCutLevelAchieved(vCut, nLevelMin) )
            {
                if ( Aig_NodeMffcExtendCut( pAig, pObj, vCut, vCut2 ) )
                {
                    nNodesSaved2 = Aig_NodeMffcLabelCut( p->pAig, pObj, vCut );
                    assert( nNodesSaved2 == nNodesSaved );
                }
                if ( Vec_PtrSize(vCut2) > p->pPars->nLeafMax )
                    Vec_PtrClear(vCut2);
                if ( Vec_PtrSize(vCut2) > 0 )
                {
                    p->nNodesExten++;
//                    printf( "%d(%d) ", Vec_PtrSize(vCut), Vec_PtrSize(vCut2) );
                }
            }
            else
                p->nNodesBelow++;
        }
p->timeCuts += Abc_Clock() - clk;

        // try the cuts
clk = Abc_Clock();
        Required = pAig->vLevelR? Aig_ObjRequiredLevel(pAig, pObj) : ABC_INFINITY;
        Dar_ManRefactorTryCuts( p, pObj, nNodesSaved, Required );
p->timeEval += Abc_Clock() - clk;

        // check the best gain
        if ( !(p->GainBest > 0 || (p->GainBest == 0 && p->pPars->fUseZeros)) )
        {
            if ( p->pGraphBest )
                Kit_GraphFree( p->pGraphBest );
            continue;
        }
//printf( "\n" );

        // if we end up here, a rewriting step is accepted
        nNodeBefore = Aig_ManNodeNum( pAig );
        pObjNew = Dar_RefactBuildGraph( pAig, p->vLeavesBest, p->pGraphBest );
        assert( (int)Aig_Regular(pObjNew)->Level <= Required );
        // replace the node
        Aig_ObjReplace( pAig, pObj, pObjNew, p->pPars->fUpdateLevel );
        // compare the gains
        nNodeAfter = Aig_ManNodeNum( pAig );
        assert( p->GainBest <= nNodeBefore - nNodeAfter );
        Kit_GraphFree( p->pGraphBest );
        p->nCutsUsed++;
//        break;
    }
p->timeTotal = Abc_Clock() - clkStart;
p->timeOther = p->timeTotal - p->timeCuts - p->timeEval;

//    Bar_ProgressStop( pProgress );
    // put the nodes into the DFS order and reassign their IDs
//    Aig_NtkReassignIds( p );
    // fix the levels
    Aig_ManFanoutStop( pAig );
    if ( p->pPars->fUpdateLevel )
        Aig_ManStopReverseLevels( pAig );
/*
    Aig_ManForEachObj( p->pAig, pObj, i )
        if ( Aig_ObjIsNode(pObj) && Aig_ObjRefs(pObj) == 0 )
        {
            printf( "Unreferenced " );
            Aig_ObjPrintVerbose( pObj, 0 );
            printf( "\n" );
        }
*/
    // remove dangling nodes (they should not be here!)
    Aig_ManCleanup( pAig );

    // stop the rewriting manager
    Dar_ManRefStop( p );
//    Aig_ManCheckPhase( pAig );
    if ( !Aig_ManCheck( pAig ) )
    {
        printf( "Dar_ManRefactor: The network check has failed.\n" );
        return 0;
    }
    return 1;

}